

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Statement * __thiscall soul::StructuralParser::parseStatement(StructuralParser *this)

{
  char *pcVar1;
  char *__s1;
  SourceCodeText *o;
  SourceCodeText *pSVar2;
  pool_ref<soul::AST::VariableDeclaration> *ppVar3;
  bool bVar4;
  int iVar5;
  Statement *pSVar6;
  Expression *pEVar7;
  Identifier name;
  Block *pBVar8;
  VariableDeclaration *pVVar9;
  long lVar10;
  long lVar11;
  pool_ref<soul::AST::Statement> local_b8;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL> variablesCreated;
  pool_ptr<soul::AST::Expression> type;
  Context local_50;
  UTF8Reader local_38;
  
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == "{") || (((pcVar1 != (char *)0x0 && (*pcVar1 == '{')) && (pcVar1[1] == '\0')))) {
    local_38.data = (char *)0x0;
    pBVar8 = parseBracedBlock(this,(pool_ptr<soul::AST::Function> *)&local_38);
    return &pBVar8->super_Statement;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a39f3);
  if (bVar4) {
    pSVar6 = parseIf(this);
    return pSVar6;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27daef);
  if (bVar4) {
    pSVar6 = parseWhileLoop(this);
    return pSVar6;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a34b9);
  if (bVar4) {
    pSVar6 = parseForLoop(this);
    return pSVar6;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a26c0);
  if (bVar4) {
    pSVar6 = parseLoopStatement(this);
    return pSVar6;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27db1f);
  if (bVar4) {
    pSVar6 = parseReturn(this);
    return pSVar6;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27daf5);
  if (bVar4) {
    variablesCreated.items =
         (pool_ref<soul::AST::VariableDeclaration> *)
         (this->super_SOULTokeniser).location.sourceCode.object;
    if ((SourceCodeText *)variablesCreated.items != (SourceCodeText *)0x0) {
      (((SourceCodeText *)variablesCreated.items)->super_RefCountedObject).refCount =
           (((SourceCodeText *)variablesCreated.items)->super_RefCountedObject).refCount + 1;
    }
    variablesCreated.numActive = (size_t)(this->super_SOULTokeniser).location.location.data;
    variablesCreated.numAllocated = (size_t)this->currentScope;
    pSVar6 = &PoolAllocator::allocate<soul::AST::BreakStatement,soul::AST::Context>
                        (&this->allocator->pool,(Context *)&variablesCreated)->super_Statement;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27ca5c);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)variablesCreated.items);
    return pSVar6;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27db52);
  if (bVar4) {
    variablesCreated.items =
         (pool_ref<soul::AST::VariableDeclaration> *)
         (this->super_SOULTokeniser).location.sourceCode.object;
    if ((SourceCodeText *)variablesCreated.items != (SourceCodeText *)0x0) {
      (((SourceCodeText *)variablesCreated.items)->super_RefCountedObject).refCount =
           (((SourceCodeText *)variablesCreated.items)->super_RefCountedObject).refCount + 1;
    }
    variablesCreated.numActive = (size_t)(this->super_SOULTokeniser).location.location.data;
    variablesCreated.numAllocated = (size_t)this->currentScope;
    pSVar6 = &PoolAllocator::allocate<soul::AST::ContinueStatement,soul::AST::Context>
                        (&this->allocator->pool,(Context *)&variablesCreated)->super_Statement;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27ca5c);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)variablesCreated.items);
    return pSVar6;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27dad4);
  if (bVar4) {
    bVar4 = true;
LAB_001ff69e:
    pSVar6 = parseLocalLetOrVar(this,bVar4);
    return pSVar6;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27dad8);
  if (bVar4) {
    bVar4 = false;
    goto LAB_001ff69e;
  }
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == "external") ||
     ((pcVar1 != (char *)0x0 && (iVar5 = strcmp(pcVar1,"external"), iVar5 == 0)))) {
    CompileMessageHelpers::createMessage<>
              ((CompileMessage *)&variablesCreated,syntax,error,
               "External constants cannot be declared inside a function");
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&variablesCreated);
    CompileMessage::~CompileMessage((CompileMessage *)&variablesCreated);
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27ca5c);
  if (bVar4) {
    pSVar6 = getNoop(this);
    return pSVar6;
  }
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27cac9);
  if (bVar4) {
    bVar4 = true;
  }
  else {
    bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29f327);
    if (!bVar4) {
      pcVar1 = (this->super_SOULTokeniser).currentType.text;
      if ((pcVar1 == "(") || (((pcVar1 != (char *)0x0 && (*pcVar1 == '(')) && (pcVar1[1] == '\0'))))
      {
        pEVar7 = parseFactor(this);
        goto LAB_001ff764;
      }
      bVar4 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::
              matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)this,(TokenType)0x27e4d6,(TokenType)0x27e4e1,(TokenType)0x27e57b,
                         (TokenType)0x27e584,(TokenType)0x27e53f,(TokenType)0x29f328,
                         (TokenType)0x27e56b,(TokenType)0x27e573);
      if (bVar4) {
        bVar4 = false;
      }
      else {
        pcVar1 = (this->super_SOULTokeniser).location.location.data;
        tryParsingType((StructuralParser *)&type,(ParseTypeContext)this);
        if (type.object != (Expression *)0x0) {
          __s1 = (this->super_SOULTokeniser).currentType.text;
          if (__s1 == "$identifier") {
LAB_001ff8ac:
            if ((*__s1 != '(') || (__s1[1] != '\0')) goto LAB_001ff8e9;
          }
          else {
            if ((__s1 == (char *)0x0) || (iVar5 = strcmp(__s1,"$identifier"), iVar5 != 0))
            goto LAB_001ff847;
            if (__s1 != "(") goto LAB_001ff8ac;
          }
          CompileMessageHelpers::createMessage<>
                    ((CompileMessage *)&variablesCreated,syntax,error,
                     "Expected a variable declaration");
          (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&variablesCreated);
          CompileMessage::~CompileMessage((CompileMessage *)&variablesCreated);
LAB_001ff8e9:
          o = (this->super_SOULTokeniser).location.sourceCode.object;
          if (o != (SourceCodeText *)0x0) {
            (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
          }
          pcVar1 = (this->super_SOULTokeniser).location.location.data;
          pSVar2 = (SourceCodeText *)this->currentScope;
          variablesCreated.items =
               (pool_ref<soul::AST::VariableDeclaration> *)variablesCreated.space;
          variablesCreated.numActive = 0;
          variablesCreated.numAllocated = 8;
          if (type.object != (Expression *)0x0) {
            name = parseIdentifier(this);
            if (o != (SourceCodeText *)0x0) {
              (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
            }
            local_b8.object = (Statement *)&variablesCreated;
            local_50.location.sourceCode.object = o;
            local_50.location.location.data = pcVar1;
            local_50.parentScope = (Scope *)pSVar2;
            parseVariableDeclaration<soul::StructuralParser::parseStatement()::_lambda(soul::AST::VariableDeclaration&)_1_>
                      (this,type.object,name,false,&local_50,(anon_class_8_1_55c32bef *)&local_b8);
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.location.sourceCode.object);
            ppVar3 = variablesCreated.items;
            if (variablesCreated.numActive == 1) {
              pVVar9 = (variablesCreated.items)->object;
            }
            else {
              if (variablesCreated.numActive != 0) {
                lVar11 = variablesCreated.numActive << 3;
                lVar10 = 0;
                do {
                  pBVar8 = getCurrentBlock(this);
                  local_b8.object = *(Statement **)((long)&ppVar3->object + lVar10);
                  std::
                  vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
                  ::emplace_back<soul::pool_ref<soul::AST::Statement>>
                            ((vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
                              *)&pBVar8->statements,&local_b8);
                  lVar10 = lVar10 + 8;
                } while (lVar11 != lVar10);
              }
              pVVar9 = (VariableDeclaration *)getNoop(this);
            }
            variablesCreated.numActive = 0;
            if ((8 < variablesCreated.numAllocated) &&
               (variablesCreated.items != (pool_ref<soul::AST::VariableDeclaration> *)0x0)) {
              operator_delete__(variablesCreated.items);
            }
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
            return &pVVar9->super_Statement;
          }
          throwInternalCompilerError("object != nullptr","operator*",0x3b);
        }
LAB_001ff847:
        if ((this->super_SOULTokeniser).input.data != pcVar1) {
          (this->super_SOULTokeniser).input.data = pcVar1;
          Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::skip(&this->super_SOULTokeniser);
        }
        pcVar1 = (this->super_SOULTokeniser).currentType.text;
        if ((pcVar1 != "$identifier") &&
           ((pcVar1 == (char *)0x0 || (iVar5 = strcmp(pcVar1,"$identifier"), iVar5 != 0)))) {
          giveErrorOnExternalKeyword(this);
          giveErrorOnAssignmentToProcessorProperty(this);
        }
        bVar4 = true;
      }
      pEVar7 = parseExpression(this,bVar4);
      goto LAB_001ff764;
    }
    bVar4 = false;
  }
  pEVar7 = parsePreIncDec(this,bVar4);
LAB_001ff764:
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27ca5c);
  return &pEVar7->super_Statement;
}

Assistant:

AST::Statement& parseStatement()
    {
        if (matches (Operator::openBrace))     return parseBracedBlock ({});
        if (matchIf (Keyword::if_))            return parseIf();
        if (matchIf (Keyword::while_))         return parseWhileLoop();
        if (matchIf (Keyword::for_))           return parseForLoop();
        if (matchIf (Keyword::loop))           return parseLoopStatement();
        if (matchIf (Keyword::return_))        return parseReturn();
        if (matchIf (Keyword::break_))         return matchEndOfStatement (allocate<AST::BreakStatement> (getContext()));
        if (matchIf (Keyword::continue_))      return matchEndOfStatement (allocate<AST::ContinueStatement> (getContext()));
        if (matchIf (Keyword::let))            return parseLocalLetOrVar (true);
        if (matchIf (Keyword::var))            return parseLocalLetOrVar (false);
        if (matches (Keyword::external))       throwError (Errors::externalNotAllowedInFunction());
        if (matchIf (Operator::semicolon))     return getNoop();
        if (matchIf (Operator::plusplus))      return matchEndOfStatement (parsePreIncDec (true));
        if (matchIf (Operator::minusminus))    return matchEndOfStatement (parsePreIncDec (false));
        if (matches (Operator::openParen))     return matchEndOfStatement (parseFactor());

        if (matchesAny (Token::literalInt32, Token::literalInt64, Token::literalFloat64,
                        Token::literalFloat32, Token::literalString, Operator::minus,
                        Token::literalImag32, Token::literalImag64))
            return parseExpressionAsStatement (false);

        {
            auto oldPos = getCurrentTokeniserPosition();

            if (auto type = tryParsingType (ParseTypeContext::variableType))
            {
                if (matches (Token::identifier))
                {
                    if (matches (Operator::openParen))
                        throwError (Errors::expectedVariableDecl());

                    auto context = getContext();
                    ArrayWithPreallocation<pool_ref<AST::VariableDeclaration>, 8> variablesCreated;

                    parseVariableDeclaration (*type, parseIdentifier(), false, context,
                                              [&] (AST::VariableDeclaration& v) { variablesCreated.push_back (v); });

                    if (variablesCreated.size() == 1)
                        return variablesCreated.front();

                    for (auto& v : variablesCreated)
                        getCurrentBlock().addStatement (v);

                    return getNoop();
                }
            }

            resetPosition (oldPos);
        }

        if (! matches (Token::identifier))
        {
            giveErrorOnExternalKeyword();
            giveErrorOnAssignmentToProcessorProperty();
        }

        return parseExpressionAsStatement (true);
    }